

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_lzdecomp.cpp
# Opt level: O2

int lzham::lzham_lib_z_inflateEnd(lzham_z_streamp pStream)

{
  uint32 uVar1;
  int iVar2;
  
  if (pStream == (lzham_z_streamp)0x0) {
    iVar2 = -2;
  }
  else {
    iVar2 = 0;
    if (pStream->state != (lzham_z_internal_state *)0x0) {
      uVar1 = lzham_lib_decompress_deinit(pStream->state);
      pStream->adler = (ulong)uVar1;
      pStream->state = (lzham_z_internal_state *)0x0;
    }
  }
  return iVar2;
}

Assistant:

int LZHAM_CDECL lzham_lib_z_inflateEnd(lzham_z_streamp pStream)
   {
      if (!pStream)
         return LZHAM_Z_STREAM_ERROR;

      lzham_decompress_state_ptr pState = static_cast<lzham_decompress_state_ptr>(pStream->state);
      if (pState)
      {
         pStream->adler = lzham_lib_decompress_deinit(pState);
         pStream->state = NULL;
      }

      return LZHAM_Z_OK;
   }